

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O0

int * If_CutArrTimeProfile(If_Man_t *p,If_Cut_t *pCut)

{
  int iVar1;
  If_Obj_t *pObj;
  If_Cut_t *pIVar2;
  int local_1c;
  int i;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = If_CutLeaveNum(pCut);
    if (iVar1 <= local_1c) break;
    pObj = If_CutLeaf(p,pCut,local_1c);
    pIVar2 = If_ObjCutBest(pObj);
    p->pArrTimeProfile[local_1c] = (int)pIVar2->Delay;
    local_1c = local_1c + 1;
  }
  return p->pArrTimeProfile;
}

Assistant:

int * If_CutArrTimeProfile( If_Man_t * p, If_Cut_t * pCut )
{
    int i;
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        p->pArrTimeProfile[i] = (int)If_ObjCutBest(If_CutLeaf(p, pCut, i))->Delay;
    return p->pArrTimeProfile;
}